

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

void __thiscall QPDFJob::Config::encrypt(Config *this,char *__block,int __edflag)

{
  long lVar1;
  QPDFJob *__p;
  
  lVar1 = **(long **)__block;
  *(int *)(lVar1 + 0x110) = __edflag;
  if (__edflag == 0x100) {
    *(undefined1 *)(lVar1 + 0x127) = 1;
  }
  std::__cxx11::string::_M_assign((string *)(lVar1 + 0xd0));
  std::__cxx11::string::_M_assign((string *)(**(long **)__block + 0xf0));
  __p = (QPDFJob *)operator_new(8);
  (__p->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__block;
  this->o = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFJob::EncConfig*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 1),(EncConfig *)__p);
  return;
}

Assistant:

std::shared_ptr<QPDFJob::EncConfig>
QPDFJob::Config::encrypt(
    int keylen, std::string const& user_password, std::string const& owner_password)
{
    o.m->keylen = keylen;
    if (keylen == 256) {
        o.m->use_aes = true;
    }
    o.m->user_password = user_password;
    o.m->owner_password = owner_password;
    return std::shared_ptr<EncConfig>(new EncConfig(this));
}